

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l0x.cpp
# Opt level: O1

void __thiscall
VL53L0X::writeRegisterMultiple(VL53L0X *this,uint8_t reg,uint8_t *source,uint8_t count)

{
  I2Cgeneric *pIVar1;
  _func_int **pp_Var2;
  undefined4 in_EAX;
  int iVar3;
  runtime_error *this_00;
  undefined7 in_register_00000009;
  undefined7 in_register_00000031;
  undefined8 in_R9;
  uint8_t data [4];
  
  pIVar1 = (this->super_VL53LXX).i2c;
  pp_Var2 = pIVar1->_vptr_I2Cgeneric;
  iVar3 = (*pp_Var2[0x1a])(pIVar1,CONCAT71(in_register_00000031,reg),
                           CONCAT71(in_register_00000009,count) & 0xffffffff,
                           &stack0xffffffffffffffec,pp_Var2,in_R9,
                           CONCAT44(*(undefined4 *)source,in_EAX));
  if ((char)iVar3 != '\0') {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Error writing block to register");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void VL53L0X::writeRegisterMultiple(uint8_t reg, const uint8_t* source, uint8_t count) {
	uint8_t data[4];
	for (uint8_t i = 0; i < 4; ++i) {
		data[i] = source[i];
	}
	bool p = this->i2c->writeBytes(reg, count, data);
	if (!p) {
		throw(std::runtime_error("Error writing block to register"));
	}
}